

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O0

int cbb_add_child(CBB *cbb,CBB *out_child,uint8_t len_len,int is_asn1)

{
  int iVar1;
  uint8_t *local_40;
  uint8_t *prefix_bytes;
  size_t offset;
  cbb_buffer_st *base;
  int is_asn1_local;
  uint8_t len_len_local;
  CBB *out_child_local;
  CBB *cbb_local;
  
  base._0_4_ = is_asn1;
  base._7_1_ = len_len;
  _is_asn1_local = out_child;
  out_child_local = cbb;
  if (cbb->child != (CBB *)0x0) {
    __assert_fail("cbb->child == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0x127,"int cbb_add_child(CBB *, CBB *, uint8_t, int)");
  }
  if (is_asn1 != 0 && len_len != '\x01') {
    __assert_fail("!is_asn1 || len_len == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                  ,0x128,"int cbb_add_child(CBB *, CBB *, uint8_t, int)");
  }
  offset = (size_t)cbb_get_base(cbb);
  prefix_bytes = (uint8_t *)((cbb_buffer_st *)offset)->len;
  iVar1 = cbb_buffer_add((cbb_buffer_st *)offset,&local_40,(ulong)base._7_1_);
  if (iVar1 != 0) {
    OPENSSL_memset(local_40,0,(ulong)base._7_1_);
    CBB_zero(_is_asn1_local);
    _is_asn1_local->is_child = '\x01';
    (_is_asn1_local->u).base.buf = (uint8_t *)offset;
    (_is_asn1_local->u).base.len = (size_t)prefix_bytes;
    (_is_asn1_local->u).child.pending_len_len = base._7_1_;
    *(byte *)((long)&_is_asn1_local->u + 0x11) =
         *(byte *)((long)&_is_asn1_local->u + 0x11) & 0xfe | (byte)(int)base & 1;
    out_child_local->child = _is_asn1_local;
  }
  cbb_local._4_4_ = (uint)(iVar1 != 0);
  return cbb_local._4_4_;
}

Assistant:

static int cbb_add_child(CBB *cbb, CBB *out_child, uint8_t len_len,
                         int is_asn1) {
  assert(cbb->child == NULL);
  assert(!is_asn1 || len_len == 1);
  struct cbb_buffer_st *base = cbb_get_base(cbb);
  size_t offset = base->len;

  // Reserve space for the length prefix.
  uint8_t *prefix_bytes;
  if (!cbb_buffer_add(base, &prefix_bytes, len_len)) {
    return 0;
  }
  OPENSSL_memset(prefix_bytes, 0, len_len);

  CBB_zero(out_child);
  out_child->is_child = 1;
  out_child->u.child.base = base;
  out_child->u.child.offset = offset;
  out_child->u.child.pending_len_len = len_len;
  out_child->u.child.pending_is_asn1 = is_asn1;
  cbb->child = out_child;
  return 1;
}